

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeGRULayer(NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  size_t val;
  LogMessage *pLVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  LayerUnion LVar4;
  ShapeRange *other;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_00;
  LogFinisher local_181;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_148,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_180,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_148);
  }
  this_00 = &this->blobShapes;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_00,(key_type *)
                                ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_110,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_180,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_110);
  }
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_00,(key_type *)
                                ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0])
  ;
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_180,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  ShapeConstraint::setName
            (pmVar3,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if (specLayer->_oneof_case_[0] == 0x19a) {
    LVar4 = specLayer->layer_;
  }
  else {
    LVar4.gru_ = Specification::GRULayerParams::default_instance();
  }
  val = (LVar4.gru_)->outputvectorsize_;
  ShapeConstraint::setChannel(pmVar2,(LVar4.gru_)->inputvectorsize_);
  ShapeConstraint::setHeight(pmVar2,1);
  ShapeConstraint::setWidth(pmVar2,1);
  ShapeConstraint::setChannel(pmVar3,val);
  ShapeConstraint::setHeight(pmVar3,1);
  ShapeConstraint::setWidth(pmVar3,1);
  if ((LVar4.gru_)->sequenceoutput_ == true) {
    other = ShapeConstraint::sequenceRange(pmVar2);
    ShapeConstraint::updateSequenceRange(pmVar3,other);
  }
  else {
    ShapeConstraint::setSequence(pmVar3,1);
  }
  if (1 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_) {
    if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_180,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](this_00,*(key_type **)
                                   ((specLayer->input_).super_RepeatedPtrFieldBase.rep_ + 1));
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_180,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](this_00,*(key_type **)
                                   ((specLayer->output_).super_RepeatedPtrFieldBase.rep_ + 1));
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_180,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_180,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_181,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_180);
    }
    ShapeConstraint::setName
              (pmVar3,*(string **)((specLayer->output_).super_RepeatedPtrFieldBase.rep_ + 1));
    ShapeConstraint::setSequence(pmVar2,1);
    ShapeConstraint::setChannel(pmVar2,val);
    ShapeConstraint::setHeight(pmVar2,1);
    ShapeConstraint::setWidth(pmVar2,1);
    ShapeConstraint::setSequence(pmVar3,1);
    ShapeConstraint::setChannel(pmVar3,val);
    ShapeConstraint::setHeight(pmVar3,1);
    ShapeConstraint::setWidth(pmVar3,1);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeGRULayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "GRU layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "GRU layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

    const Specification::GRULayerParams& recurrent = specLayer.gru();

    size_t inSize = (size_t)recurrent.inputvectorsize();
    size_t outSize = (size_t)recurrent.outputvectorsize();

    inputShape.setChannel(inSize);
    inputShape.setHeight(1);
    inputShape.setWidth(1);

    outputShape.setChannel(outSize);
    outputShape.setHeight(1);
    outputShape.setWidth(1);
    if (recurrent.sequenceoutput()) {
        outputShape.updateSequenceRange(inputShape.sequenceRange());
    }
    else {
        outputShape.setSequence(1);
    }

    if (specLayer.input_size() < 2) {
        return;
    }

    ShapeConstraint& stateInShape = blobShapes[specLayer.input(1)];
    ShapeConstraint& stateOutShape = blobShapes[specLayer.output(1)];
    stateOutShape.setName(specLayer.output(1));

    stateInShape.setSequence(1);
    stateInShape.setChannel(outSize);
    stateInShape.setHeight(1);
    stateInShape.setWidth(1);

    stateOutShape.setSequence(1);
    stateOutShape.setChannel(outSize);
    stateOutShape.setHeight(1);
    stateOutShape.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "GRU layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "GRU layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

}